

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
* __thiscall
poly::vector_impl::
allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
::copy_assign_impl(allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
                   *this,long *a)

{
  pointer puVar1;
  
  if (a[1] - *a == 0) {
    puVar1 = (pointer)0x0;
  }
  else {
    puVar1 = custom::
             Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>
             ::allocate((Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>
                         *)this,a[1] - *a);
  }
  tidy(this);
  this->_storage = puVar1;
  this->_end_storage = puVar1 + (a[1] - *a);
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::false_type /*unused*/)
        {
            pointer s = nullptr;
            if (a.size()) {
                s = get_allocator_ref().allocate(a.size());
            }
            tidy();
            _storage     = s;
            _end_storage = s + a.size();
            return *this;
        }